

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

void __thiscall gui::DialogBoxStyle::DialogBoxStyle(DialogBoxStyle *this,Gui *gui)

{
  Vector2f local_28;
  
  Style::Style(&this->super_Style,gui);
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__DialogBoxStyle_0027c3b8;
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->rect_,&local_28);
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->titleBar_,&local_28);
  (this->titlePadding_).x = 0.0;
  (this->titlePadding_).y = 0.0;
  (this->buttonPadding_).x = 0.0;
  (this->buttonPadding_).y = 0.0;
  return;
}

Assistant:

DialogBoxStyle::DialogBoxStyle(const Gui& gui) :
    Style(gui) {
}